

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Var __thiscall Minisat::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  Solver *this_00;
  long lVar1;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  float new_activity;
  int v;
  VarData *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar2;
  lbool local_21;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_10 = nVars((Solver *)0x131bc9);
  this_00 = (Solver *)(in_RDI + 0x2b0);
  local_14 = (int)mkLit(local_10,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             this_00,(EVP_PKEY_CTX *)&local_14);
  local_18 = (int)mkLit(local_10,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2b0),(EVP_PKEY_CTX *)&local_18);
  local_1c = (int)mkLit(local_10,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2e8),(EVP_PKEY_CTX *)&local_1c);
  local_20 = (int)mkLit(local_10,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2e8),(EVP_PKEY_CTX *)&local_20);
  lbool::lbool(&local_21,'\x02');
  vec<Minisat::lbool>::push
            ((vec<Minisat::lbool> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (lbool *)in_stack_ffffffffffffff18);
  mkVarData(0xffffffff,0);
  vec<Minisat::Solver::VarData>::push
            ((vec<Minisat::Solver::VarData> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  vec<unsigned_int>::push
            ((vec<unsigned_int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->reason);
  vec<double>::push((vec<double> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    (double *)in_stack_ffffffffffffff18);
  if (*(int *)(in_RDI + 0x8c) == 1) {
    drand((double *)(in_RDI + 0x78));
  }
  vec<double>::push((vec<double> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    (double *)in_stack_ffffffffffffff18);
  vec<double>::push((vec<double> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    (double *)in_stack_ffffffffffffff18);
  vec<unsigned_int>::push
            ((vec<unsigned_int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->reason);
  vec<unsigned_int>::push
            ((vec<unsigned_int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->reason);
  vec<unsigned_int>::push
            ((vec<unsigned_int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->reason);
  vec<unsigned_int>::push
            ((vec<unsigned_int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->reason);
  vec<char>::push((vec<char> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                  (char *)in_stack_ffffffffffffff18);
  vec<unsigned_long>::push
            ((vec<unsigned_long> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (unsigned_long *)in_stack_ffffffffffffff18);
  vec<unsigned_long>::push
            ((vec<unsigned_long> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (unsigned_long *)in_stack_ffffffffffffff18);
  lVar1 = in_RDI + 0x330;
  bVar2 = local_9;
  if ((*(byte *)(in_RDI + 0x88) & 1) != 0) {
    bVar2 = local_9 ^ 0xff;
  }
  vec<char>::push((vec<char> *)CONCAT17(bVar2,in_stack_ffffffffffffff20),
                  (char *)in_stack_ffffffffffffff18);
  vec<char>::push((vec<char> *)CONCAT17(bVar2,in_stack_ffffffffffffff20));
  vec<Minisat::Lit>::capacity((vec<Minisat::Lit> *)this_00,(int)((ulong)lVar1 >> 0x20));
  vec<Minisat::Lit>::capacity((vec<Minisat::Lit> *)this_00,(int)((ulong)lVar1 >> 0x20));
  vec<double>::push((vec<double> *)CONCAT17(bVar2,in_stack_ffffffffffffff20),
                    (double *)in_stack_ffffffffffffff18);
  vec<double>::push((vec<double> *)CONCAT17(bVar2,in_stack_ffffffffffffff20),
                    (double *)in_stack_ffffffffffffff18);
  vec<int>::push((vec<int> *)CONCAT17(bVar2,in_stack_ffffffffffffff20),
                 (int *)in_stack_ffffffffffffff18);
  setDecisionVar(this_00,(Var)((ulong)lVar1 >> 0x20),SUB81((ulong)lVar1 >> 0x18,0));
  return local_10;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar)
{
    int v = nVars();
    watches_bin.init(mkLit(v, false));
    watches_bin.init(mkLit(v, true));
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    assigns.push(l_Undef);
    vardata.push(mkVarData(CRef_Undef, 0));
    oldreasons.push(CRef_Undef);
    activity_CHB.push(0);
    float new_activity = 0;
    if (init_act == 1)
        new_activity = drand(random_seed) * 0.00001;
    else if (init_act == 2)
        new_activity = 1000 / v;
    else if (init_act == 3)
        new_activity = v;
    activity_VSIDS.push(new_activity);
    activity_distance.push(0);

    picked.push(0);
    conflicted.push(0);
    almost_conflicted.push(0);
#ifdef ANTI_EXPLORATION
    canceled.push(0);
#endif

    seen.push(0);
    seen2.push(0);
    seen2.push(0);
    polarity.push(invert_pol ? !sign : sign);
    decision.push();
    trail.capacity(v + 1);
    old_trail.capacity(v + 1);

    var_iLevel.push(0);
    var_iLevel_tmp.push(0);
    pathCs.push(0);

    // TODO: make sure to add new data structures also to reserveVars below!

    setDecisionVar(v, dvar);
    return v;
}